

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

Variant * __thiscall spirv_cross::Variant::operator=(Variant *this,Variant *other)

{
  pointer pOVar1;
  Variant *other_local;
  Variant *this_local;
  
  if (this != other) {
    if (this->holder != (IVariant *)0x0) {
      pOVar1 = ::std::
               unique_ptr<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
               ::operator->(this->group->pools + this->type);
      (*pOVar1->_vptr_ObjectPoolBase[2])(pOVar1,this->holder);
    }
    this->holder = other->holder;
    this->group = other->group;
    this->type = other->type;
    this->allow_type_rewrite = (bool)(other->allow_type_rewrite & 1);
    other->holder = (IVariant *)0x0;
    other->type = TypeNone;
  }
  return this;
}

Assistant:

Variant &operator=(Variant &&other) SPIRV_CROSS_NOEXCEPT
	{
		if (this != &other)
		{
			if (holder)
				group->pools[type]->deallocate_opaque(holder);
			holder = other.holder;
			group = other.group;
			type = other.type;
			allow_type_rewrite = other.allow_type_rewrite;

			other.holder = nullptr;
			other.type = TypeNone;
		}
		return *this;
	}